

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a5d8eb::HandleRPathSetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  cmArgumentParser<void> *this;
  reference str;
  cmMakefile *pcVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  static_string_view sVar5;
  char local_401;
  cmAlphaNum local_400;
  cmAlphaNum local_3d0;
  undefined1 local_3a0 [8];
  string message;
  cmAlphaNum local_350;
  string local_320;
  bool local_2f9;
  undefined1 local_2f8 [7];
  bool changed;
  string emsg;
  cmFileTimes ft;
  undefined1 local_2c8 [7];
  bool success;
  cmAlphaNum local_298;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  undefined4 local_1f4;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1c0;
  string local_190;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_170;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_160;
  undefined1 local_150 [8];
  ParseResult parseResult;
  undefined1 local_f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmArgumentParser<void> parser;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  newRPath;
  string file;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  std::__cxx11::string::string
            ((string *)
             &newRPath.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&parser.super_Base.Bindings.Positions.
                      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                      .
                      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                      ._M_impl + 0x10));
  cmArgumentParser<void>::cmArgumentParser
            ((cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f0);
  sVar5 = ::cm::operator____s("FILE",4);
  this = cmArgumentParser<void>::Bind<std::__cxx11::string>
                   ((cmArgumentParser<void> *)
                    &unknownArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar5,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &newRPath.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged);
  sVar5 = ::cm::operator____s("NEW_RPATH",9);
  parseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
       sVar5.super_string_view._M_len;
  cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
            (this,sVar5,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&parser.super_Base.Bindings.Positions.
                        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        .
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl + 0x10));
  local_170 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (args);
  local_160 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_170,1);
  cmArgumentParser<void>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((ParseResult *)local_150,
             (cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f0,0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f0);
  if (bVar1) {
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_150,pcVar2);
    if (bVar1) {
      args_local._7_1_ = true;
      local_1f4 = 1;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           ((long)&parser.super_Base.Bindings.Positions.
                                   super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                   .
                                   super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                   ._M_impl + 0x10));
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileExists
                            ((string *)
                             &newRPath.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged,true);
          if (bVar1) {
            cmFileTimes::cmFileTimes
                      ((cmFileTimes *)((long)&emsg.field_2 + 8),
                       (string *)
                       &newRPath.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
            std::__cxx11::string::string((string *)local_2f8);
            pbVar4 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)((long)&parser.super_Base.Bindings.Positions.
                                            super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                            .
                                            super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                            ._M_impl + 0x10));
            bVar1 = cmSystemTools::SetRPath
                              ((string *)
                               &newRPath.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_engaged,pbVar4,(string *)local_2f8,&local_2f9);
            if (!bVar1) {
              cmAlphaNum::cmAlphaNum(&local_350,"RPATH_SET could not write new RPATH:\n  ");
              pbVar4 = std::
                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)((long)&parser.super_Base.Bindings.Positions.
                                              super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                              .
                                              super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                              ._M_impl + 0x10));
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&message.field_2 + 8),pbVar4);
              cmStrCat<char[17],std::__cxx11::string,char[2],std::__cxx11::string>
                        (&local_320,&local_350,(cmAlphaNum *)((long)&message.field_2 + 8),
                         (char (*) [17])"\nto the file:\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &newRPath.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,(char (*) [2])0xd5e5f1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8);
              cmExecutionStatus::SetError(status,&local_320);
              std::__cxx11::string::~string((string *)&local_320);
            }
            ft.times._M_t.
            super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t
            .super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
            super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_ = bVar1;
            if (ft.times._M_t.
                super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
                .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_) {
              if ((local_2f9 & 1U) != 0) {
                cmAlphaNum::cmAlphaNum(&local_3d0,"Set runtime path of \"");
                cmAlphaNum::cmAlphaNum
                          (&local_400,
                           (string *)
                           &newRPath.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
                pbVar4 = std::
                         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)((long)&parser.super_Base.Bindings.Positions.
                                                super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                .
                                                super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                                ._M_impl + 0x10));
                local_401 = '\"';
                cmStrCat<char[7],std::__cxx11::string,char>
                          ((string *)local_3a0,&local_3d0,&local_400,(char (*) [7])"\" to \"",pbVar4
                           ,&local_401);
                pcVar2 = cmExecutionStatus::GetMakefile(status);
                cmMakefile::DisplayStatus(pcVar2,(string *)local_3a0,-1.0);
                std::__cxx11::string::~string((string *)local_3a0);
              }
              cmFileTimes::Store((cmFileTimes *)((long)&emsg.field_2 + 8),
                                 (string *)
                                 &newRPath.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_engaged);
            }
            args_local._7_1_ =
                 ft.times._M_t.
                 super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
                 .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_;
            local_1f4 = 1;
            std::__cxx11::string::~string((string *)local_2f8);
            cmFileTimes::~cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8));
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_298,"RPATH_SET given FILE \"");
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)local_2c8,
                       (string *)
                       &newRPath.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged);
            cmStrCat<char[23]>(&local_268,&local_298,(cmAlphaNum *)local_2c8,
                               (char (*) [23])"\" that does not exist.");
            cmExecutionStatus::SetError(status,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            args_local._7_1_ = false;
            local_1f4 = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"RPATH_SET not given NEW_RPATH option.",&local_241);
          cmExecutionStatus::SetError(status,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
          args_local._7_1_ = false;
          local_1f4 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"RPATH_SET not given FILE option.",&local_219);
        cmExecutionStatus::SetError(status,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator(&local_219);
        args_local._7_1_ = false;
        local_1f4 = 1;
      }
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_1c0,"RPATH_SET given unrecognized argument \"");
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f0);
    cmAlphaNum::cmAlphaNum(&local_1f0,str);
    cmStrCat<char[3]>(&local_190,&local_1c0,&local_1f0,(char (*) [3])0xd299d5);
    cmExecutionStatus::SetError(status,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    args_local._7_1_ = false;
    local_1f4 = 1;
  }
  ArgumentParser::ParseResult::~ParseResult((ParseResult *)local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f0);
  cmArgumentParser<void>::~cmArgumentParser
            ((cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&parser.super_Base.Bindings.Positions.
                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                       .
                       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                       ._M_impl + 0x10));
  std::__cxx11::string::~string
            ((string *)
             &newRPath.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  return args_local._7_1_;
}

Assistant:

bool HandleRPathSetCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  // Evaluate arguments.
  std::string file;
  cm::optional<std::string> newRPath;
  cmArgumentParser<void> parser;
  std::vector<std::string> unknownArgs;
  parser.Bind("FILE"_s, file).Bind("NEW_RPATH"_s, newRPath);
  ArgumentParser::ParseResult parseResult =
    parser.Parse(cmMakeRange(args).advance(1), &unknownArgs);
  if (!unknownArgs.empty()) {
    status.SetError(cmStrCat("RPATH_SET given unrecognized argument \"",
                             unknownArgs.front(), "\"."));
    return false;
  }
  if (parseResult.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if (file.empty()) {
    status.SetError("RPATH_SET not given FILE option.");
    return false;
  }
  if (!newRPath) {
    status.SetError("RPATH_SET not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    status.SetError(
      cmStrCat("RPATH_SET given FILE \"", file, "\" that does not exist."));
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool changed;

  if (!cmSystemTools::SetRPath(file, *newRPath, &emsg, &changed)) {
    status.SetError(cmStrCat("RPATH_SET could not write new RPATH:\n  ",
                             *newRPath, "\nto the file:\n  ", file, "\n",
                             emsg));
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message =
        cmStrCat("Set runtime path of \"", file, "\" to \"", *newRPath, '"');
      status.GetMakefile().DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}